

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

bool __thiscall gl4cts::GLSL420Pack::GLSLTestBase::testCompute(GLSLTestBase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *__filename;
  texture *ptVar4;
  texture color_tex;
  texture source_tex;
  program program;
  shaderSource compute_shader;
  shaderSource local_228;
  shaderSource local_208;
  shaderSource local_1e8;
  shaderSource local_1c8;
  MessageBuilder message;
  
  ptVar4 = &color_tex;
  color_tex.m_context = (this->super_TestBase).super_TestCase.m_context;
  color_tex.m_id = 0;
  color_tex.m_texture_type = TEX_2D;
  program.m_tesselation_control_shader_id = 0;
  program.m_tesselation_evaluation_shader_id = 0;
  program.m_vertex_shader_id = 0;
  program.m_compute_shader_id = 0;
  program.m_fragment_shader_id = 0;
  program.m_geometry_shader_id = 0;
  program.m_program_object_id = 0;
  source_tex.m_id = 0;
  source_tex.m_texture_type = TEX_2D;
  compute_shader.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  compute_shader.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  compute_shader.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __filename = (char *)0x0;
  source_tex.m_context = color_tex.m_context;
  program.m_context = color_tex.m_context;
  TestBase::initShaderSource(&this->super_TestBase,COMPUTE_SHADER,false,&compute_shader);
  if (((compute_shader.m_parts.
        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
        ._M_impl.super__Vector_impl_data._M_start)->m_code)._M_string_length == 0) {
    bVar1 = true;
  }
  else {
    message.m_log = (TestLog *)0x0;
    message.m_str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)0x0;
    message.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
    local_1c8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Utils::program::build
              (&program,&compute_shader,(shaderSource *)&message,&local_1c8,&local_1e8,&local_208,
               &local_228,(GLchar **)0x0,0,false);
    std::
    vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ::~vector(&local_228.m_parts);
    std::
    vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ::~vector(&local_208.m_parts);
    std::
    vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ::~vector(&local_1e8.m_parts);
    std::
    vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ::~vector(&local_1c8.m_parts);
    std::
    vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ::~vector((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               *)&message);
    iVar2 = (*(program.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1680))(program.m_program_object_id);
    dVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(dVar3,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x47c9);
    Utils::texture::create(&color_tex,0x10,0x10,0x8058);
    bindTextureToimage(this,&program,&color_tex,"uni_image");
    iVar2 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
              [0xc])(this,&source_tex);
    if ((GLchar *)CONCAT44(extraout_var_00,iVar2) != (GLchar *)0x0) {
      bindTextureToSampler(this,&program,&source_tex,(GLchar *)CONCAT44(extraout_var_00,iVar2));
    }
    (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[8])
              (this,&program);
    iVar2 = (*((this->super_TestBase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
            )();
    (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x528))(0x10,0x10,1);
    dVar3 = (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x800))();
    glu::checkError(dVar3,"DispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x828);
    bVar1 = checkResults(this,&color_tex);
    (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xf])(this)
    ;
    __filename = (char *)ptVar4;
  }
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&compute_shader.m_parts);
  Utils::texture::release(&source_tex);
  Utils::program::remove(&program,__filename);
  Utils::texture::release(&color_tex);
  return bVar1;
}

Assistant:

bool GLSLTestBase::testCompute()
{
	/* Test Result */
	bool result = true;

	/* GL objects */
	Utils::texture color_tex(m_context);
	Utils::program program(m_context);
	Utils::texture source_tex(m_context);

	/* Shaders */
	Utils::shaderSource compute_shader;
	initShaderSource(Utils::COMPUTE_SHADER, false, compute_shader);

	/* Check if test support compute shaders */
	if (true == compute_shader.m_parts[0].m_code.empty())
	{
		return true;
	}

	/* Build program */
	try
	{
		program.build(compute_shader, 0 /* fragment shader */, 0 /* geometry shader */,
					  0 /* tesselation control shader */, 0 /* tesselation evaluation shader */, 0 /* vertex shader */,
					  0 /* varying names */, 0 /* n varying names */, false);
	}
	catch (Utils::shaderCompilationException& exc)
	{
		/* Something wrong with compilation, test case failed */
		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Shader compilation failed. Error message: " << exc.m_error_message;

		Utils::program::printShaderSource(exc.m_shader_source, message);

		message << tcu::TestLog::EndMessage;

		return false;
	}
	catch (Utils::programLinkageException& exc)
	{
		/* Something wrong with linking, test case failed */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Program linking failed. Error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		return false;
	}

/* Log shaders, for debugging */
#if IS_DEBUG
	{
		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		Utils::program::printShaderSource(compute_shader, message);

		message << tcu::TestLog::EndMessage;
	}
#endif /* IS_DEBUG */

	/* Set current program */
	program.use();

	/* Prepare image unit */
	prepareImage(program, color_tex);

	/* Test specific preparation of source texture */
	const GLchar* sampler_name = prepareSourceTexture(source_tex);
	if (0 != sampler_name)
	{
		bindTextureToSampler(program, source_tex, sampler_name);
	}

	/* Set up uniforms */
	prepareUniforms(program);

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Draw */
	gl.dispatchCompute(m_color_texture_width, m_color_texture_height, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

	/* Return result of verification */
	result = checkResults(color_tex);

	/* Release extra resource for the test */
	releaseResource();

	return result;
}